

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<Minisat::SimpSolver::ElimLt>::clear
          (Heap<Minisat::SimpSolver::ElimLt> *this,bool dealloc)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < (this->heap).sz) {
    piVar1 = (this->heap).data;
    piVar2 = (this->indices).data;
    lVar3 = 0;
    do {
      piVar2[piVar1[lVar3]] = -1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->heap).sz);
  }
  piVar1 = (this->heap).data;
  if ((piVar1 != (int *)0x0) && ((this->heap).sz = 0, dealloc)) {
    free(piVar1);
    (this->heap).data = (int *)0x0;
    (this->heap).cap = 0;
  }
  return;
}

Assistant:

void clear(bool dealloc = false)
    {
        for (int i = 0; i < heap.size(); i++) indices[heap[i]] = -1;
        heap.clear(dealloc);
    }